

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

sat_solver * Pdr_ManCreateSolver(Pdr_Man_t *p,int k)

{
  int iVar1;
  sat_solver *psVar2;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  int k_local;
  Pdr_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vSolvers);
  if (iVar1 != k) {
    __assert_fail("Vec_PtrSize(p->vSolvers) == k",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                  ,0x32,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
  }
  iVar1 = Vec_VecSize(p->vClauses);
  if (iVar1 != k) {
    __assert_fail("Vec_VecSize(p->vClauses) == k",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                  ,0x33,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
  }
  iVar1 = Vec_IntSize(p->vActVars);
  if (iVar1 != k) {
    __assert_fail("Vec_IntSize(p->vActVars) == k",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                  ,0x34,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
  }
  psVar2 = sat_solver_new();
  psVar2 = Pdr_ManNewSolver(psVar2,p,k,(uint)(k == 0));
  Vec_PtrPush(p->vSolvers,psVar2);
  Vec_VecExpand(p->vClauses,k);
  Vec_IntPush(p->vActVars,0);
  for (local_2c = 0; iVar1 = Saig_ManPoNum(p->pAig), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,local_2c);
    Pdr_ObjSatVar(p,k,1,pObj_00);
  }
  return psVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates new SAT solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Pdr_ManCreateSolver( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_VecSize(p->vClauses) == k );
    assert( Vec_IntSize(p->vActVars) == k );
    // create new solver
    pSat = sat_solver_new();
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_VecExpand( p->vClauses, k );
    Vec_IntPush( p->vActVars, 0 );
    // add property cone
    Saig_ManForEachPo( p->pAig, pObj, i )
        Pdr_ObjSatVar( p, k, 1, pObj );
    return pSat;
}